

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O0

udword __thiscall Opcode::AABBTree::Walk(AABBTree *this,WalkingCallback callback,void *user_data)

{
  udword local_28;
  udword local_24;
  udword CurrentDepth;
  udword MaxDepth;
  void *user_data_local;
  WalkingCallback callback_local;
  AABBTree *this_local;
  
  local_24 = 0;
  local_28 = 0;
  _CurrentDepth = user_data;
  user_data_local = callback;
  callback_local = (WalkingCallback)this;
  Walk::Local::_Walk(&this->super_AABBTreeNode,&local_24,&local_28,callback,user_data);
  return local_24;
}

Assistant:

udword AABBTree::Walk(WalkingCallback callback, void* user_data) const
{
	// Call it without callback to compute max depth
	udword MaxDepth = 0;
	udword CurrentDepth = 0;

	struct Local
	{
		static void _Walk(const AABBTreeNode* current_node, udword& max_depth, udword& current_depth, WalkingCallback callback, void* user_data)
		{
			// Checkings
			if(!current_node)	return;
			// Entering a new node => increase depth
			current_depth++;
			// Keep track of max depth
			if(current_depth>max_depth)	max_depth = current_depth;

			// Callback
			if(callback && !(callback)(current_node, current_depth, user_data))	return;

			// Recurse
			if(current_node->GetPos())	{ _Walk(current_node->GetPos(), max_depth, current_depth, callback, user_data);	current_depth--;	}
			if(current_node->GetNeg())	{ _Walk(current_node->GetNeg(), max_depth, current_depth, callback, user_data);	current_depth--;	}
		}
	};
	Local::_Walk(this, MaxDepth, CurrentDepth, callback, user_data);
	return MaxDepth;
}